

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testMissingUpdatableModelParameters(void)

{
  bool bVar1;
  ostream *poVar2;
  ostream *this;
  int iVar3;
  Model m;
  Result res;
  undefined1 local_30 [40];
  
  CoreML::Specification::Model::Model(&m);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(&m);
  CoreML::Model::validate(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    this = (ostream *)std::operator<<(poVar2,":");
    iVar3 = 0x2ea;
  }
  else {
    CoreML::Specification::Model::Clear(&m);
    buildBasicUpdatableModelWithMeanSquaredError(&m);
    CoreML::Model::validate((Result *)local_30,&m);
    CoreML::Result::operator=(&res,(Result *)local_30);
    std::__cxx11::string::~string((string *)(local_30 + 8));
    bVar1 = CoreML::Result::good(&res);
    iVar3 = 0;
    if (!bVar1) goto LAB_001664c1;
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    this = (ostream *)std::operator<<(poVar2,":");
    iVar3 = 0x2f4;
  }
  poVar2 = (ostream *)std::ostream::operator<<(this,iVar3);
  poVar2 = std::operator<<(poVar2,": error: ");
  poVar2 = std::operator<<(poVar2,"!((res).good())");
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = 1;
LAB_001664c1:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar3;
}

Assistant:

int testMissingUpdatableModelParameters() {

    Specification::Model m;

    // basic neural network model with CCE and softmax without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // clear model and redo test with MSE
    m.Clear();

    // basic neural network model with MSE without any updatable model parameters.
    buildBasicUpdatableModelWithMeanSquaredError(m);

    // expect validation to fail due to missing updatable model parameters.
    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    return 0;
}